

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O1

void __thiscall NaPNStatistics::print_stat(NaPNStatistics *this,char *szTitle,FILE *fp)

{
  NaVector *this_00;
  NaVector *this_01;
  NaReal NVar1;
  NaReal NVar2;
  NaReal NVar3;
  NaReal NVar4;
  double dVar5;
  double dVar6;
  NaReal NVar7;
  uint uVar8;
  uint uVar9;
  NaReal *pNVar10;
  char *pcVar11;
  
  if (szTitle == (char *)0x0) {
    szTitle = NaPetriNode::name(&this->super_NaPetriNode);
    if (fp == (FILE *)0x0) {
      pcVar11 = "Statistics of node \'%s\':\n";
      goto LAB_00140a2e;
    }
    pcVar11 = "Statistics of node \'%s\':\n";
  }
  else {
    if (fp == (FILE *)0x0) {
      pcVar11 = "%s\n";
LAB_00140a2e:
      NaPrintLog(pcVar11,szTitle);
      goto LAB_00140a35;
    }
    pcVar11 = "%s\n";
  }
  fprintf((FILE *)fp,pcVar11,szTitle);
LAB_00140a35:
  if (fp == (FILE *)0x0) {
    NaPrintLog("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n");
  }
  else {
    fwrite("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n",0x4b,1,
           (FILE *)fp);
  }
  this_00 = &this->Mean;
  uVar8 = NaVector::dim(this_00);
  if (uVar8 != 0) {
    this_01 = &this->StdDev;
    uVar8 = 0;
    do {
      if (fp == (FILE *)0x0) {
        pNVar10 = NaVector::operator[](&this->Min,uVar8);
        NVar1 = *pNVar10;
        pNVar10 = NaVector::operator[](&this->Max,uVar8);
        NVar2 = *pNVar10;
        pNVar10 = NaVector::operator[](this_00,uVar8);
        NVar3 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        NVar4 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        dVar5 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        dVar6 = *pNVar10;
        pNVar10 = NaVector::operator[](&this->RMS,uVar8);
        NVar7 = *pNVar10;
        uVar9 = NaPetriNode::activations(&this->super_NaPetriNode);
        NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,dVar5 * dVar6,NVar7,
                   (ulong)uVar9);
      }
      else {
        pNVar10 = NaVector::operator[](&this->Min,uVar8);
        NVar1 = *pNVar10;
        pNVar10 = NaVector::operator[](&this->Max,uVar8);
        NVar2 = *pNVar10;
        pNVar10 = NaVector::operator[](this_00,uVar8);
        NVar3 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        NVar4 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        dVar5 = *pNVar10;
        pNVar10 = NaVector::operator[](this_01,uVar8);
        dVar6 = *pNVar10;
        pNVar10 = NaVector::operator[](&this->RMS,uVar8);
        NVar7 = *pNVar10;
        uVar9 = NaPetriNode::activations(&this->super_NaPetriNode);
        fprintf((FILE *)fp,"%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,
                dVar5 * dVar6,NVar7,(ulong)uVar9);
      }
      uVar8 = uVar8 + 1;
      uVar9 = NaVector::dim(this_00);
    } while (uVar8 < uVar9);
  }
  return;
}

Assistant:

void
NaPNStatistics::print_stat (const char* szTitle, FILE* fp)
{
    if(NULL == szTitle){
      if(NULL == fp)
        NaPrintLog("Statistics of node '%s':\n", name());
      else
        fprintf(fp, "Statistics of node '%s':\n", name());
    }else{
      if(NULL == fp)
        NaPrintLog("%s\n", szTitle);
      else
	fprintf(fp ,"%s\n", szTitle);
    }
    if(NULL == fp)
      NaPrintLog("       Min        Max         Mean     StdDev "	\
		 "Dispersion        RMS Volume\n");
    else
      fprintf(fp, "       Min        Max         Mean     StdDev "	\
	      "Dispersion        RMS Volume\n");
    for(unsigned i = 0; i < Mean.dim(); ++i){
      if(NULL == fp)
	NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",
		   Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		   RMS[i], activations());
      else
	fprintf(fp, "%10g %10g %12g %10g %10g %10g %u\n",
		Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		RMS[i], activations());
    }
}